

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O0

void __thiscall CArmInstruction::FormatOpcode(CArmInstruction *this,char *Dest,char *Source)

{
  int iVar1;
  char *local_20;
  char *Source_local;
  char *Dest_local;
  CArmInstruction *this_local;
  
  Source_local = Dest;
  for (local_20 = Source; *local_20 != '\0'; local_20 = local_20 + 1) {
    switch(*local_20) {
    case 'A':
      if (((this->Opcode).flags & 0x800U) == 0) {
        iVar1 = sprintf(Source_local,"%s",ArmAddressingModes + "\x03\x01\x02"[(this->Vars).Opcode.a]
                       );
      }
      else {
        iVar1 = sprintf(Source_local,"%s",ArmAddressingModes + "\x03\x01\x02"[(this->Vars).Opcode.a]
                       );
      }
      Source_local = Source_local + iVar1;
      break;
    default:
      *Source_local = *local_20;
      Source_local = Source_local + 1;
      break;
    case 'C':
      iVar1 = sprintf(Source_local,"%s",ArmConditions + (this->Vars).Opcode.c);
      Source_local = Source_local + iVar1;
      break;
    case 'S':
      if (((this->Vars).Opcode.s & 1U) != 0) {
        *Source_local = 's';
        Source_local = Source_local + 1;
      }
      break;
    case 'X':
      if (((this->Vars).Opcode.x & 1U) == 0) {
        *Source_local = 'b';
      }
      else {
        *Source_local = 't';
      }
      Source_local = Source_local + 1;
      break;
    case 'Y':
      if (((this->Vars).Opcode.y & 1U) == 0) {
        *Source_local = 'b';
      }
      else {
        *Source_local = 't';
      }
      Source_local = Source_local + 1;
    }
  }
  *Source_local = '\0';
  return;
}

Assistant:

void CArmInstruction::FormatOpcode(char* Dest, const char* Source) const
{
	while (*Source != 0)
	{
		switch (*Source)
		{
		case 'C':	// condition
			Dest += sprintf(Dest,"%s",ArmConditions[Vars.Opcode.c]);
			Source++;
			break;
		case 'S':	// set flag
			if (Vars.Opcode.s) *Dest++ = 's';
			Source++;
			break;
		case 'A':	// addressing mode
			if (Opcode.flags & ARM_LOAD)
			{
				Dest += sprintf(Dest,"%s",ArmAddressingModes[LdmModes[Vars.Opcode.a]]);
			} else {
				Dest += sprintf(Dest,"%s",ArmAddressingModes[StmModes[Vars.Opcode.a]]);
			}
			Source++;
			break;
		case 'X':	// x flag
			if (!Vars.Opcode.x) *Dest++ = 'b';
			else *Dest++ = 't';
			Source++;
			break;
		case 'Y':	// y flag
			if (!Vars.Opcode.y) *Dest++ = 'b';
			else *Dest++ = 't';
			Source++;
			break;
		default:
			*Dest++ = *Source++;
			break;
		}
	}
	*Dest = 0;
}